

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.cpp
# Opt level: O1

QImage * __thiscall QImage::operator=(QImage *this,QImage *image)

{
  QImageData *pQVar1;
  long in_FS_OFFSET;
  undefined8 local_68;
  undefined8 uStack_60;
  QImage local_50;
  undefined1 local_38 [16];
  QImageData *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((image->super_QPaintDevice).painters == 0) {
    pQVar1 = image->d;
    if (pQVar1 != (QImageData *)0x0) {
      LOCK();
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar1 = this->d;
    if (pQVar1 != (QImageData *)0x0) {
      LOCK();
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (pQVar1 = this->d, pQVar1 != (QImageData *)0x0)) {
        QImageData::~QImageData(pQVar1);
        operator_delete(pQVar1,0xa0);
      }
    }
    this->d = image->d;
  }
  else {
    local_68 = 0;
    uStack_60 = 0xffffffffffffffff;
    copy(&local_50,(EVP_PKEY_CTX *)image,(EVP_PKEY_CTX *)&local_68);
    local_28 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)local_38);
    pQVar1 = local_50.d;
    local_38._0_8_ = &PTR__QImage_007e2f38;
    local_50.d = (QImageData *)0x0;
    local_28 = this->d;
    this->d = pQVar1;
    ~QImage((QImage *)local_38);
    ~QImage(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QImage &QImage::operator=(const QImage &image)
{
    if (image.paintingActive()) {
        operator=(image.copy());
    } else {
        if (image.d)
            image.d->ref.ref();
        if (d && !d->ref.deref())
            delete d;
        d = image.d;
    }
    return *this;
}